

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestInterfaceDynamicImpl::call
          (TestInterfaceDynamicImpl *this,Method method,
          CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> context)

{
  PointerBuilder builder;
  PointerReader reader;
  PointerReader reader_00;
  PointerReader reader_01;
  Reader reader_02;
  ReaderFor<bool> RVar1;
  int32_t iVar2;
  long in_RSI;
  bool bVar3;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  Fault f;
  DebugComparison<int,_int> _kjCondition_1;
  Reader params_1;
  Reader params;
  ArrayPtr<const_char> local_780;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  ReaderFor<DynamicStruct> local_750;
  undefined1 local_718 [8];
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 aStack_710;
  None *local_580;
  char *local_578;
  size_t local_570;
  bool local_568;
  undefined1 local_560 [8];
  Exception local_558;
  Reader local_3c8;
  Maybe<kj::Exception> local_390;
  Reader local_1f8;
  uint local_1c0 [100];
  
  bVar3 = method.proto._reader.pointerCount == 0;
  aStack_710.value.ownFile.content.size_ = (size_t)method.proto._reader.pointers;
  if (bVar3) {
    aStack_710.value.ownFile.content.size_ = (size_t)(SegmentReader *)0x0;
  }
  aStack_710._16_4_ = 0x7fffffff;
  if (!bVar3) {
    aStack_710._16_4_ = method.proto._reader.nestingLimit;
  }
  local_718._0_4_ = UNKNOWN;
  local_718._4_4_ = 0;
  aStack_710._0_4_ = 0;
  aStack_710._4_4_ = 0;
  if (!bVar3) {
    local_718._0_4_ = (Type)method.proto._reader.segment;
    local_718._4_4_ = method.proto._reader.segment._4_4_;
    aStack_710._0_4_ = method.proto._reader.capTable._0_4_;
    aStack_710._4_4_ = method.proto._reader.capTable._4_4_;
  }
  local_780 = (ArrayPtr<const_char>)
              PointerReader::getBlob<capnp::Text>((PointerReader *)local_718,(void *)0x0,0);
  if (local_780.size_ == 4) {
    if (*(int *)local_780.ptr == 0x6f6f66) {
      **(int **)(in_RSI + 0x20) = **(int **)(in_RSI + 0x20) + 1;
      (**(context.hook)->_vptr_CallContextHook)(local_718,context.hook);
      reader.segment._4_4_ = local_718._4_4_;
      reader.segment._0_4_ = local_718._0_4_;
      reader._28_4_ = aStack_710._20_4_;
      reader.nestingLimit = aStack_710._16_4_;
      reader.capTable = (CapTableReader *)aStack_710.value.ownFile.content.ptr;
      reader.pointer = (WirePointer *)aStack_710.value.ownFile.content.size_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                ((Reader *)&local_390,reader,context.paramType);
      name.content.size_ = 2;
      name.content.ptr = "i";
      DynamicStruct::Reader::get((Reader *)local_718,(Reader *)&local_390,name);
      iVar2 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)local_718);
      local_558.ownFile.content.disposer._0_1_ = iVar2 == 0x7b;
      local_560._0_4_ = 0x7b;
      local_558.ownFile.content.ptr = " == ";
      local_558.ownFile.content.size_ = (size_t)&DAT_00000005;
      local_560._4_4_ = iVar2;
      DynamicValue::Reader::~Reader((Reader *)local_718);
      if ((iVar2 != 0x7b) && (kj::_::Debug::minSeverity < 3)) {
        local_1c0[0] = 0x7b;
        name_00.content.size_ = 2;
        name_00.content.ptr = "i";
        DynamicStruct::Reader::get((Reader *)local_718,(Reader *)&local_390,name_00);
        local_3c8.schema.super_Schema.raw._0_4_ =
             DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)local_718);
        kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x1f5,ERROR,
                   "\"failed: expected \" \"(123) == (params.get(\\\"i\\\").as<int>())\", _kjCondition, 123, params.get(\"i\").as<int>()"
                   ,(char (*) [54])"failed: expected (123) == (params.get(\"i\").as<int>())",
                   (DebugComparison<int,_int> *)local_560,(int *)local_1c0,(int *)&local_3c8);
        DynamicValue::Reader::~Reader((Reader *)local_718);
      }
      name_01.content.size_ = 2;
      name_01.content.ptr = "j";
      DynamicStruct::Reader::get((Reader *)local_718,(Reader *)&local_390,name_01);
      RVar1 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)local_718);
      local_560[0] = RVar1;
      DynamicValue::Reader::~Reader((Reader *)local_718);
      if (kj::_::Debug::minSeverity < 3 && !RVar1) {
        kj::_::Debug::log<char_const(&)[44],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x1f6,ERROR,
                   "\"failed: expected \" \"params.get(\\\"j\\\").as<bool>()\", _kjCondition",
                   (char (*) [44])"failed: expected params.get(\"j\").as<bool>()",
                   (DebugExpression<bool> *)local_560);
      }
      local_1c0[0] = local_1c0[0] & 0xffffff00;
      (*(context.hook)->_vptr_CallContextHook[2])(local_718,context.hook);
      builder.segment._4_4_ = local_718._4_4_;
      builder.segment._0_4_ = local_718._0_4_;
      builder.capTable = (CapTableBuilder *)aStack_710.value.ownFile.content.ptr;
      builder.pointer = (WirePointer *)aStack_710.value.ownFile.content.size_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                ((Builder *)local_560,builder,context.resultType);
      local_718._0_4_ = TEXT;
      aStack_710.value.ownFile.content.ptr = "foo";
      aStack_710.value.ownFile.content.size_ = (size_t)&DAT_00000004;
      name_03.content.size_ = 2;
      name_03.content.ptr = "x";
      DynamicStruct::Builder::set((Builder *)local_560,name_03,(Reader *)local_718);
      DynamicValue::Reader::~Reader((Reader *)local_718);
      goto LAB_0017b202;
    }
    if (*(int *)local_780.ptr == 0x7a6162) {
      **(int **)(in_RSI + 0x20) = **(int **)(in_RSI + 0x20) + 1;
      (**(context.hook)->_vptr_CallContextHook)(local_718,context.hook);
      reader_00.segment._4_4_ = local_718._4_4_;
      reader_00.segment._0_4_ = local_718._0_4_;
      reader_00._28_4_ = aStack_710._20_4_;
      reader_00.nestingLimit = aStack_710._16_4_;
      reader_00.capTable = (CapTableReader *)aStack_710.value.ownFile.content.ptr;
      reader_00.pointer = (WirePointer *)aStack_710.value.ownFile.content.size_;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (&local_1f8,reader_00,context.paramType);
      name_02.content.size_ = 2;
      name_02.content.ptr = "s";
      DynamicStruct::Reader::get((Reader *)local_718,&local_1f8,name_02);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                (&local_750,(Reader *)local_718);
      reader_02.reader.segment = local_750.reader.segment;
      reader_02.schema.super_Schema.raw = local_750.schema.super_Schema.raw;
      reader_02.reader.capTable = local_750.reader.capTable;
      reader_02.reader.data = local_750.reader.data;
      reader_02.reader.pointers = local_750.reader.pointers;
      reader_02.reader.dataSize = local_750.reader.dataSize;
      reader_02.reader.pointerCount = local_750.reader.pointerCount;
      reader_02.reader._38_2_ = local_750.reader._38_2_;
      reader_02.reader.nestingLimit = local_750.reader.nestingLimit;
      reader_02.reader._44_4_ = local_750.reader._44_4_;
      checkDynamicTestMessage(reader_02);
      DynamicValue::Reader::~Reader((Reader *)local_718);
      (*(context.hook)->_vptr_CallContextHook[1])(context.hook);
      (**(context.hook)->_vptr_CallContextHook)(&local_770,context.hook);
      reader_01.capTable = (CapTableReader *)uStack_768;
      reader_01.segment = (SegmentReader *)local_770;
      reader_01.pointer = (WirePointer *)local_760;
      reader_01._24_8_ = uStack_758;
      PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                (&local_3c8,reader_01,context.paramType);
      local_560._0_4_ = local_560._0_4_ & 0xffffff00;
      kj::Maybe<kj::Exception>::Maybe(&local_390,(Maybe<kj::Exception> *)local_560);
      bVar3 = local_390.ptr.isSet;
      kj::Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)local_718,&local_390);
      local_580 = (None *)&kj::none;
      local_578 = " != ";
      local_570 = 5;
      local_568 = bVar3;
      if (local_390.ptr.isSet == true) {
        kj::Exception::~Exception(&local_390.ptr.field_1.value);
      }
      if (local_560[0] == true) {
        kj::Exception::~Exception(&local_558);
      }
      if ((local_568 == false) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::
        log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x1fe,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none\", _kjCondition"
                   ,(char (*) [89])
                    "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none"
                   ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_718);
      }
      if (local_718[0] == true) {
        kj::Exception::~Exception(&aStack_710.value);
      }
      goto LAB_0017b202;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],capnp::Text::Reader&>
            ((Fault *)local_718,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0x201,UNIMPLEMENTED,(char *)0x0,"\"Method not implemented\", methodName",
             (char (*) [23])"Method not implemented",(Reader *)&local_780);
  kj::_::Debug::Fault::~Fault((Fault *)local_718);
LAB_0017b202:
  kj::_::readyNow();
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> call(InterfaceSchema::Method method,
                         CallContext<DynamicStruct, DynamicStruct> context) override {
    auto methodName = method.getProto().getName();
    if (methodName == "foo") {
      ++callCount;
      auto params = context.getParams();
      EXPECT_EQ(123, params.get("i").as<int>());
      EXPECT_TRUE(params.get("j").as<bool>());
      context.getResults().set("x", "foo");
      return kj::READY_NOW;
    } else if (methodName == "baz") {
      ++callCount;
      auto params = context.getParams();
      checkDynamicTestMessage(params.get("s").as<DynamicStruct>());
      context.releaseParams();
      EXPECT_ANY_THROW(context.getParams());
      return kj::READY_NOW;
    } else {
      KJ_UNIMPLEMENTED("Method not implemented", methodName) { break; }
      return kj::READY_NOW;
    }
  }